

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groupnorm_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::GroupNorm_x86_fma::forward_inplace(GroupNorm_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  void *pvVar1;
  void *pvVar2;
  void *pvVar3;
  int q_1;
  int iVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  float *pfVar11;
  undefined1 (*pauVar12) [32];
  float *gamma;
  undefined1 (*pauVar13) [32];
  int q;
  int iVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  float *beta;
  long lVar22;
  long lVar23;
  uint *puVar24;
  float fVar25;
  float fVar34;
  float fVar35;
  float fVar36;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  undefined1 auVar33 [64];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar46;
  float fVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 in_ZMM10 [64];
  
  iVar14 = bottom_top_blob->dims;
  iVar17 = (this->super_GroupNorm).group;
  uVar8 = (long)(this->super_GroupNorm).channels / (long)iVar17;
  iVar4 = (int)uVar8;
  lVar5 = (long)iVar4;
  if (iVar14 == 2) {
    iVar14 = bottom_top_blob->w;
    iVar9 = iVar14 * iVar4;
    lVar6 = 0;
    if (iVar4 < 1) {
      iVar4 = 0;
    }
    for (lVar10 = 0; lVar10 < iVar17; lVar10 = lVar10 + 1) {
      lVar18 = lVar10 * lVar5;
      pvVar1 = bottom_top_blob->data;
      pauVar13 = (undefined1 (*) [32])
                 (lVar18 * bottom_top_blob->w * bottom_top_blob->elemsize + (long)pvVar1);
      fVar35 = 0.0;
      fVar36 = 0.0;
      fVar25 = 0.0;
      fVar34 = 0.0;
      fVar37 = 0.0;
      fVar38 = 0.0;
      fVar39 = 0.0;
      fVar40 = 0.0;
      lVar21 = 0;
      pauVar12 = pauVar13;
      for (iVar17 = 0; iVar17 + 7 < iVar9; iVar17 = iVar17 + 8) {
        fVar25 = fVar25 + *(float *)*pauVar12;
        fVar34 = fVar34 + *(float *)(*pauVar12 + 4);
        fVar35 = fVar35 + *(float *)(*pauVar12 + 8);
        fVar36 = fVar36 + *(float *)(*pauVar12 + 0xc);
        fVar37 = fVar37 + *(float *)(*pauVar12 + 0x10);
        fVar38 = fVar38 + *(float *)(*pauVar12 + 0x14);
        fVar39 = fVar39 + *(float *)(*pauVar12 + 0x18);
        fVar40 = fVar40 + *(float *)(*pauVar12 + 0x1c);
        pauVar12 = pauVar12 + 1;
        lVar21 = lVar21 + 8;
      }
      pfVar11 = (float *)((long)(this->super_GroupNorm).gamma_data.data +
                         (this->super_GroupNorm).gamma_data.elemsize * lVar18);
      auVar29._0_4_ = fVar37 + fVar25;
      auVar29._4_4_ = fVar38 + fVar34;
      auVar29._8_4_ = fVar39 + fVar35;
      auVar29._12_4_ = fVar40 + fVar36;
      auVar32 = vshufpd_avx(auVar29,auVar29,1);
      auVar30._0_4_ = auVar32._0_4_ + auVar29._0_4_;
      auVar30._4_4_ = auVar32._4_4_ + auVar29._4_4_;
      auVar30._8_4_ = auVar32._8_4_ + auVar29._8_4_;
      auVar30._12_4_ = auVar32._12_4_ + auVar29._12_4_;
      auVar32 = ZEXT816(0) << 0x40;
      while( true ) {
        fVar35 = auVar32._4_4_;
        fVar36 = auVar32._8_4_;
        fVar25 = auVar32._12_4_;
        if (iVar9 <= iVar17 + 3) break;
        auVar32._0_4_ = auVar32._0_4_ + *(float *)*pauVar12;
        auVar32._4_4_ = fVar35 + *(float *)(*pauVar12 + 4);
        auVar32._8_4_ = fVar36 + *(float *)(*pauVar12 + 8);
        auVar32._12_4_ = fVar25 + *(float *)(*pauVar12 + 0xc);
        pauVar12 = (undefined1 (*) [32])(*pauVar12 + 0x10);
        iVar17 = iVar17 + 4;
        lVar21 = lVar21 + 4;
      }
      auVar29 = vshufpd_avx(auVar32,auVar32,1);
      auVar43._0_4_ = auVar29._0_4_ + auVar32._0_4_;
      auVar43._4_4_ = auVar29._4_4_ + fVar35;
      auVar43._8_4_ = auVar29._8_4_ + fVar36;
      auVar43._12_4_ = auVar29._12_4_ + fVar25;
      auVar29 = vmovshdup_avx(auVar43);
      auVar32 = vhaddps_avx(auVar30,auVar30);
      fVar35 = auVar32._0_4_ + auVar29._0_4_ + auVar43._0_4_;
      lVar19 = bottom_top_blob->elemsize * lVar6 * (long)bottom_top_blob->w;
      for (; (int)lVar21 < iVar9; lVar21 = lVar21 + 1) {
        fVar35 = fVar35 + *(float *)((long)pvVar1 + lVar21 * 4 + lVar19);
      }
      fVar35 = fVar35 * (1.0 / (float)iVar9);
      auVar32 = vshufps_avx(ZEXT416((uint)fVar35),ZEXT416((uint)fVar35),0);
      auVar55._16_16_ = auVar32;
      auVar55._0_16_ = auVar32;
      lVar21 = 0;
      auVar29 = ZEXT816(0) << 0x20;
      pauVar12 = pauVar13;
      for (iVar17 = 0; iVar17 + 7 < iVar9; iVar17 = iVar17 + 8) {
        auVar60 = vsubps_avx(*pauVar12,auVar55);
        auVar29 = vfmadd231ps_fma(ZEXT1632(auVar29),auVar60,auVar60);
        pauVar12 = pauVar12 + 1;
        lVar21 = lVar21 + 8;
      }
      auVar50._0_4_ = auVar29._0_4_ + 0.0;
      auVar50._4_4_ = auVar29._4_4_ + 0.0;
      auVar50._8_4_ = auVar29._8_4_ + 0.0;
      auVar50._12_4_ = auVar29._12_4_ + 0.0;
      auVar29 = vshufpd_avx(auVar50,auVar50,1);
      auVar51._0_4_ = auVar29._0_4_ + auVar50._0_4_;
      auVar51._4_4_ = auVar29._4_4_ + auVar50._4_4_;
      auVar51._8_4_ = auVar29._8_4_ + auVar50._8_4_;
      auVar51._12_4_ = auVar29._12_4_ + auVar50._12_4_;
      auVar29 = ZEXT816(0) << 0x40;
      for (; iVar17 + 3 < iVar9; iVar17 = iVar17 + 4) {
        auVar30 = vsubps_avx(*(undefined1 (*) [16])*pauVar12,auVar32);
        auVar29 = vfmadd231ps_fma(auVar29,auVar30,auVar30);
        pauVar12 = (undefined1 (*) [32])(*pauVar12 + 0x10);
        lVar21 = lVar21 + 4;
      }
      auVar30 = vshufpd_avx(auVar29,auVar29,1);
      auVar32 = vhaddps_avx(auVar51,auVar51);
      auVar31._0_4_ = auVar30._0_4_ + auVar29._0_4_;
      auVar31._4_4_ = auVar30._4_4_ + auVar29._4_4_;
      auVar31._8_4_ = auVar30._8_4_ + auVar29._8_4_;
      auVar31._12_4_ = auVar30._12_4_ + auVar29._12_4_;
      auVar29 = vmovshdup_avx(auVar31);
      auVar33 = ZEXT464((uint)(auVar32._0_4_ + auVar29._0_4_ + auVar31._0_4_));
      for (; (int)lVar21 < iVar9; lVar21 = lVar21 + 1) {
        auVar32 = ZEXT416((uint)(*(float *)((long)pvVar1 + lVar21 * 4 + lVar19) - fVar35));
        auVar32 = vfmadd231ss_fma(auVar33._0_16_,auVar32,auVar32);
        auVar33 = ZEXT1664(auVar32);
      }
      auVar32 = vfmadd213ss_fma(auVar33._0_16_,ZEXT416((uint)(1.0 / (float)iVar9)),
                                ZEXT416((uint)(this->super_GroupNorm).eps));
      auVar32 = vsqrtss_avx(auVar32,auVar32);
      fVar36 = 1.0 / auVar32._0_4_;
      auVar32 = ZEXT416((uint)fVar36);
      auVar29 = ZEXT416((uint)(fVar36 * -fVar35));
      if ((this->super_GroupNorm).affine == 0) {
        auVar30 = vshufps_avx(auVar32,auVar32,0);
        auVar60._16_16_ = auVar30;
        auVar60._0_16_ = auVar30;
        auVar43 = vshufps_avx(auVar29,auVar29,0);
        auVar64._16_16_ = auVar43;
        auVar64._0_16_ = auVar43;
        lVar18 = 0;
        for (iVar17 = 0; iVar17 + 7 < iVar9; iVar17 = iVar17 + 8) {
          auVar50 = vfmadd132ps_fma(*pauVar13,auVar64,auVar60);
          *pauVar13 = ZEXT1632(auVar50);
          pauVar13 = pauVar13 + 1;
          lVar18 = lVar18 + 8;
        }
        for (; iVar17 + 3 < iVar9; iVar17 = iVar17 + 4) {
          auVar50 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar13,auVar43,auVar30);
          *(undefined1 (*) [16])*pauVar13 = auVar50;
          pauVar13 = (undefined1 (*) [32])(*pauVar13 + 0x10);
          lVar18 = lVar18 + 4;
        }
        for (; (int)lVar18 < iVar9; lVar18 = lVar18 + 1) {
          auVar30 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)pvVar1 + lVar18 * 4 + lVar19)),auVar29,
                                    auVar32);
          *(int *)((long)pvVar1 + lVar18 * 4 + lVar19) = auVar30._0_4_;
        }
      }
      else {
        puVar24 = (uint *)((long)(this->super_GroupNorm).beta_data.data +
                          lVar18 * (this->super_GroupNorm).beta_data.elemsize);
        for (iVar17 = 0; iVar17 != iVar4; iVar17 = iVar17 + 1) {
          fVar35 = *pfVar11 * fVar36;
          auVar43 = vfmadd213ss_fma(ZEXT416((uint)*pfVar11),auVar29,ZEXT416(*puVar24));
          auVar32 = vshufps_avx(ZEXT416((uint)fVar35),ZEXT416((uint)fVar35),0);
          auVar66._16_16_ = auVar32;
          auVar66._0_16_ = auVar32;
          auVar30 = vshufps_avx(auVar43,auVar43,0);
          auVar68._16_16_ = auVar30;
          auVar68._0_16_ = auVar30;
          for (iVar16 = 0; iVar16 + 7 < iVar14; iVar16 = iVar16 + 8) {
            auVar50 = vfmadd132ps_fma(*pauVar13,auVar68,auVar66);
            *pauVar13 = ZEXT1632(auVar50);
            pauVar13 = pauVar13 + 1;
          }
          for (; iVar16 + 3 < iVar14; iVar16 = iVar16 + 4) {
            auVar50 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar13,auVar30,auVar32);
            *(undefined1 (*) [16])*pauVar13 = auVar50;
            pauVar13 = (undefined1 (*) [32])(*pauVar13 + 0x10);
          }
          for (; iVar16 < iVar14; iVar16 = iVar16 + 1) {
            auVar32 = vfmadd132ss_fma(ZEXT416(*(uint *)*pauVar13),auVar43,ZEXT416((uint)fVar35));
            *(int *)*pauVar13 = auVar32._0_4_;
            pauVar13 = (undefined1 (*) [32])(*pauVar13 + 4);
          }
          pfVar11 = pfVar11 + 1;
          puVar24 = puVar24 + 1;
        }
      }
      iVar17 = (this->super_GroupNorm).group;
      lVar6 = lVar6 + lVar5;
    }
  }
  else if (iVar14 == 1) {
    lVar6 = 0;
    for (lVar10 = 0; lVar10 < iVar17; lVar10 = lVar10 + 1) {
      pvVar1 = bottom_top_blob->data;
      pauVar13 = (undefined1 (*) [32])(lVar10 * lVar5 * bottom_top_blob->elemsize + (long)pvVar1);
      pvVar2 = (this->super_GroupNorm).gamma_data.data;
      pvVar3 = (this->super_GroupNorm).beta_data.data;
      lVar18 = 0;
      fVar35 = 0.0;
      fVar36 = 0.0;
      fVar25 = 0.0;
      fVar34 = 0.0;
      fVar37 = 0.0;
      fVar38 = 0.0;
      fVar39 = 0.0;
      fVar40 = 0.0;
      pauVar12 = pauVar13;
      for (iVar14 = 0; iVar14 + 7 < iVar4; iVar14 = iVar14 + 8) {
        fVar25 = fVar25 + *(float *)*pauVar12;
        fVar34 = fVar34 + *(float *)(*pauVar12 + 4);
        fVar35 = fVar35 + *(float *)(*pauVar12 + 8);
        fVar36 = fVar36 + *(float *)(*pauVar12 + 0xc);
        fVar37 = fVar37 + *(float *)(*pauVar12 + 0x10);
        fVar38 = fVar38 + *(float *)(*pauVar12 + 0x14);
        fVar39 = fVar39 + *(float *)(*pauVar12 + 0x18);
        fVar40 = fVar40 + *(float *)(*pauVar12 + 0x1c);
        pauVar12 = pauVar12 + 1;
        lVar18 = lVar18 + 8;
      }
      auVar26._0_4_ = fVar37 + fVar25;
      auVar26._4_4_ = fVar38 + fVar34;
      auVar26._8_4_ = fVar39 + fVar35;
      auVar26._12_4_ = fVar40 + fVar36;
      auVar32 = vshufpd_avx(auVar26,auVar26,1);
      auVar27._0_4_ = auVar32._0_4_ + auVar26._0_4_;
      auVar27._4_4_ = auVar32._4_4_ + auVar26._4_4_;
      auVar27._8_4_ = auVar32._8_4_ + auVar26._8_4_;
      auVar27._12_4_ = auVar32._12_4_ + auVar26._12_4_;
      auVar41 = ZEXT816(0) << 0x40;
      while( true ) {
        fVar35 = auVar41._4_4_;
        fVar36 = auVar41._8_4_;
        fVar25 = auVar41._12_4_;
        if (iVar4 <= iVar14 + 3) break;
        auVar41._0_4_ = auVar41._0_4_ + *(float *)*pauVar12;
        auVar41._4_4_ = fVar35 + *(float *)(*pauVar12 + 4);
        auVar41._8_4_ = fVar36 + *(float *)(*pauVar12 + 8);
        auVar41._12_4_ = fVar25 + *(float *)(*pauVar12 + 0xc);
        pauVar12 = (undefined1 (*) [32])(*pauVar12 + 0x10);
        iVar14 = iVar14 + 4;
        lVar18 = lVar18 + 4;
      }
      auVar32 = vshufpd_avx(auVar41,auVar41,1);
      auVar42._0_4_ = auVar32._0_4_ + auVar41._0_4_;
      auVar42._4_4_ = auVar32._4_4_ + fVar35;
      auVar42._8_4_ = auVar32._8_4_ + fVar36;
      auVar42._12_4_ = auVar32._12_4_ + fVar25;
      auVar29 = vmovshdup_avx(auVar42);
      auVar32 = vhaddps_avx(auVar27,auVar27);
      fVar35 = auVar32._0_4_ + auVar29._0_4_ + auVar42._0_4_;
      lVar21 = bottom_top_blob->elemsize * lVar6;
      for (; (int)lVar18 < iVar4; lVar18 = lVar18 + 1) {
        fVar35 = fVar35 + *(float *)((long)pvVar1 + lVar18 * 4 + lVar21);
      }
      fVar35 = fVar35 * (1.0 / (float)iVar4);
      auVar32 = vshufps_avx(ZEXT416((uint)fVar35),ZEXT416((uint)fVar35),0);
      auVar54._16_16_ = auVar32;
      auVar54._0_16_ = auVar32;
      lVar18 = 0;
      auVar29 = ZEXT816(0) << 0x20;
      pauVar12 = pauVar13;
      for (iVar14 = 0; iVar14 + 7 < iVar4; iVar14 = iVar14 + 8) {
        auVar55 = vsubps_avx(*pauVar12,auVar54);
        auVar29 = vfmadd231ps_fma(ZEXT1632(auVar29),auVar55,auVar55);
        pauVar12 = pauVar12 + 1;
        lVar18 = lVar18 + 8;
      }
      auVar48._0_4_ = auVar29._0_4_ + 0.0;
      auVar48._4_4_ = auVar29._4_4_ + 0.0;
      auVar48._8_4_ = auVar29._8_4_ + 0.0;
      auVar48._12_4_ = auVar29._12_4_ + 0.0;
      auVar29 = vshufpd_avx(auVar48,auVar48,1);
      auVar49._0_4_ = auVar29._0_4_ + auVar48._0_4_;
      auVar49._4_4_ = auVar29._4_4_ + auVar48._4_4_;
      auVar49._8_4_ = auVar29._8_4_ + auVar48._8_4_;
      auVar49._12_4_ = auVar29._12_4_ + auVar48._12_4_;
      auVar29 = ZEXT816(0) << 0x40;
      for (; iVar14 + 3 < iVar4; iVar14 = iVar14 + 4) {
        auVar30 = vsubps_avx(*(undefined1 (*) [16])*pauVar12,auVar32);
        auVar29 = vfmadd231ps_fma(auVar29,auVar30,auVar30);
        pauVar12 = (undefined1 (*) [32])(*pauVar12 + 0x10);
        lVar18 = lVar18 + 4;
      }
      auVar30 = vshufpd_avx(auVar29,auVar29,1);
      auVar32 = vhaddps_avx(auVar49,auVar49);
      auVar28._0_4_ = auVar30._0_4_ + auVar29._0_4_;
      auVar28._4_4_ = auVar30._4_4_ + auVar29._4_4_;
      auVar28._8_4_ = auVar30._8_4_ + auVar29._8_4_;
      auVar28._12_4_ = auVar30._12_4_ + auVar29._12_4_;
      auVar29 = vmovshdup_avx(auVar28);
      auVar33 = ZEXT464((uint)(auVar32._0_4_ + auVar29._0_4_ + auVar28._0_4_));
      for (; (int)lVar18 < iVar4; lVar18 = lVar18 + 1) {
        auVar32 = ZEXT416((uint)(*(float *)((long)pvVar1 + lVar18 * 4 + lVar21) - fVar35));
        auVar32 = vfmadd231ss_fma(auVar33._0_16_,auVar32,auVar32);
        auVar33 = ZEXT1664(auVar32);
      }
      auVar32 = vfmadd213ss_fma(auVar33._0_16_,ZEXT416((uint)(1.0 / (float)iVar4)),
                                ZEXT416((uint)(this->super_GroupNorm).eps));
      auVar32 = vsqrtss_avx(auVar32,auVar32);
      fVar36 = 1.0 / auVar32._0_4_;
      auVar32 = ZEXT416((uint)fVar36);
      auVar29 = ZEXT416((uint)(fVar36 * -fVar35));
      if ((this->super_GroupNorm).affine == 0) {
        auVar30 = vshufps_avx(auVar32,auVar32,0);
        auVar59._16_16_ = auVar30;
        auVar59._0_16_ = auVar30;
        auVar43 = vshufps_avx(auVar29,auVar29,0);
        auVar63._16_16_ = auVar43;
        auVar63._0_16_ = auVar43;
        lVar18 = 0;
        for (iVar14 = 0; iVar14 + 7 < iVar4; iVar14 = iVar14 + 8) {
          auVar50 = vfmadd132ps_fma(*pauVar13,auVar63,auVar59);
          *pauVar13 = ZEXT1632(auVar50);
          pauVar13 = pauVar13 + 1;
          lVar18 = lVar18 + 8;
        }
        for (; iVar14 + 3 < iVar4; iVar14 = iVar14 + 4) {
          auVar50 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar13,auVar43,auVar30);
          *(undefined1 (*) [16])*pauVar13 = auVar50;
          pauVar13 = (undefined1 (*) [32])(*pauVar13 + 0x10);
          lVar18 = lVar18 + 4;
        }
        for (; (int)lVar18 < iVar4; lVar18 = lVar18 + 1) {
          auVar30 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)pvVar1 + lVar18 * 4 + lVar21)),auVar29,
                                    auVar32);
          *(int *)((long)pvVar1 + lVar18 * 4 + lVar21) = auVar30._0_4_;
        }
      }
      else {
        auVar30 = vshufps_avx(auVar32,auVar32,0);
        auVar43 = vshufps_avx(auVar29,auVar29,0);
        auVar62._16_16_ = auVar43;
        auVar62._0_16_ = auVar43;
        lVar23 = (this->super_GroupNorm).beta_data.elemsize * lVar6;
        lVar22 = (this->super_GroupNorm).gamma_data.elemsize * lVar6;
        lVar19 = 0;
        lVar18 = 0;
        iVar14 = 0;
        while( true ) {
          fVar35 = auVar30._0_4_;
          fVar36 = auVar30._4_4_;
          fVar25 = auVar30._8_4_;
          if (iVar4 <= iVar14 + 7) break;
          auVar55 = *(undefined1 (*) [32])((long)pvVar2 + lVar18 + lVar22);
          auVar33._0_4_ = auVar55._0_4_ * fVar35;
          auVar33._4_4_ = auVar55._4_4_ * fVar36;
          auVar33._8_4_ = auVar55._8_4_ * fVar25;
          auVar33._12_4_ = auVar55._12_4_ * auVar30._12_4_;
          auVar33._16_4_ = auVar55._16_4_ * fVar35;
          auVar33._20_4_ = auVar55._20_4_ * fVar36;
          auVar33._28_36_ = in_ZMM10._28_36_;
          auVar33._24_4_ = auVar55._24_4_ * fVar25;
          in_ZMM10 = ZEXT3264(auVar33._0_32_);
          auVar50 = vfmadd213ps_fma(auVar55,auVar62,
                                    *(undefined1 (*) [32])((long)pvVar3 + lVar18 + lVar23));
          auVar50 = vfmadd231ps_fma(ZEXT1632(auVar50),auVar33._0_32_,
                                    *(undefined1 (*) [32])((long)pvVar1 + lVar18 + lVar21));
          *(undefined1 (*) [32])((long)pvVar1 + lVar18 + lVar21) = ZEXT1632(auVar50);
          iVar14 = iVar14 + 8;
          lVar18 = lVar18 + 0x20;
          lVar19 = lVar19 + 8;
        }
        for (; iVar14 + 3 < iVar4; iVar14 = iVar14 + 4) {
          auVar50 = *(undefined1 (*) [16])((long)pvVar2 + lVar18 + lVar22);
          auVar61._0_4_ = auVar50._0_4_ * fVar35;
          auVar61._4_4_ = auVar50._4_4_ * fVar36;
          auVar61._8_4_ = auVar50._8_4_ * fVar25;
          auVar61._12_4_ = auVar50._12_4_ * auVar30._12_4_;
          auVar50 = vfmadd213ps_fma(auVar50,auVar43,
                                    *(undefined1 (*) [16])((long)pvVar3 + lVar18 + lVar23));
          auVar50 = vfmadd231ps_fma(auVar50,auVar61,
                                    *(undefined1 (*) [16])((long)pvVar1 + lVar18 + lVar21));
          *(undefined1 (*) [16])((long)pvVar1 + lVar18 + lVar21) = auVar50;
          lVar18 = lVar18 + 0x10;
          lVar19 = lVar19 + 4;
        }
        for (; (int)lVar19 < iVar4; lVar19 = lVar19 + 1) {
          auVar30 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)pvVar1 + lVar19 * 4 + lVar21)),auVar29,
                                    auVar32);
          auVar30 = vfmadd213ss_fma(auVar30,ZEXT416(*(uint *)((long)pvVar2 + lVar19 * 4 + lVar22)),
                                    ZEXT416(*(uint *)((long)pvVar3 + lVar19 * 4 + lVar23)));
          *(int *)((long)pvVar1 + lVar19 * 4 + lVar21) = auVar30._0_4_;
        }
      }
      iVar17 = (this->super_GroupNorm).group;
      lVar6 = lVar6 + lVar5;
    }
  }
  else if (iVar14 - 3U < 2) {
    iVar14 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    uVar20 = 0;
    uVar8 = uVar8 & 0xffffffff;
    if (iVar4 < 1) {
      uVar8 = uVar20;
    }
    fVar35 = 1.0 / (float)(iVar14 * iVar4);
    for (; (long)uVar20 < (long)iVar17; uVar20 = uVar20 + 1) {
      lVar18 = uVar20 * lVar5;
      uVar7 = bottom_top_blob->elemsize;
      lVar6 = bottom_top_blob->cstep * lVar18 * uVar7;
      pvVar1 = bottom_top_blob->data;
      uVar15 = (long)bottom_top_blob->d * uVar7 *
               (long)bottom_top_blob->h * (long)bottom_top_blob->w + 0xf & 0xfffffffffffffff0;
      lVar10 = uVar15 - uVar15 % uVar7;
      fVar36 = 0.0;
      for (uVar7 = 0; uVar7 != uVar8; uVar7 = uVar7 + 1) {
        pfVar11 = (float *)((long)pvVar1 + lVar10 * uVar7 + lVar6);
        fVar25 = 0.0;
        fVar34 = 0.0;
        fVar37 = 0.0;
        fVar38 = 0.0;
        fVar39 = 0.0;
        fVar40 = 0.0;
        fVar46 = 0.0;
        fVar47 = 0.0;
        for (iVar17 = 0; iVar17 + 7 < iVar14; iVar17 = iVar17 + 8) {
          fVar37 = fVar37 + *pfVar11;
          fVar38 = fVar38 + pfVar11[1];
          fVar25 = fVar25 + pfVar11[2];
          fVar34 = fVar34 + pfVar11[3];
          fVar39 = fVar39 + pfVar11[4];
          fVar40 = fVar40 + pfVar11[5];
          fVar46 = fVar46 + pfVar11[6];
          fVar47 = fVar47 + pfVar11[7];
          pfVar11 = pfVar11 + 8;
        }
        auVar44._0_4_ = fVar39 + fVar37;
        auVar44._4_4_ = fVar40 + fVar38;
        auVar44._8_4_ = fVar46 + fVar25;
        auVar44._12_4_ = fVar47 + fVar34;
        auVar32 = vshufpd_avx(auVar44,auVar44,1);
        auVar45._0_4_ = auVar32._0_4_ + auVar44._0_4_;
        auVar45._4_4_ = auVar32._4_4_ + auVar44._4_4_;
        auVar45._8_4_ = auVar32._8_4_ + auVar44._8_4_;
        auVar45._12_4_ = auVar32._12_4_ + auVar44._12_4_;
        auVar32 = vmovshdup_avx(auVar45);
        auVar52 = ZEXT816(0) << 0x40;
        while( true ) {
          fVar25 = auVar52._4_4_;
          fVar34 = auVar52._8_4_;
          fVar37 = auVar52._12_4_;
          if (iVar14 <= iVar17 + 3) break;
          auVar52._0_4_ = auVar52._0_4_ + *pfVar11;
          auVar52._4_4_ = fVar25 + pfVar11[1];
          auVar52._8_4_ = fVar34 + pfVar11[2];
          auVar52._12_4_ = fVar37 + pfVar11[3];
          pfVar11 = pfVar11 + 4;
          iVar17 = iVar17 + 4;
        }
        auVar29 = vshufpd_avx(auVar52,auVar52,1);
        auVar53._0_4_ = auVar29._0_4_ + auVar52._0_4_;
        auVar53._4_4_ = auVar29._4_4_ + fVar25;
        auVar53._8_4_ = auVar29._8_4_ + fVar34;
        auVar53._12_4_ = auVar29._12_4_ + fVar37;
        auVar29 = vmovshdup_avx(auVar53);
        fVar36 = auVar32._0_4_ + fVar36 + auVar45._0_4_ + auVar29._0_4_ + auVar53._0_4_;
        for (; iVar17 < iVar14; iVar17 = iVar17 + 1) {
          fVar36 = fVar36 + *pfVar11;
          pfVar11 = pfVar11 + 1;
        }
      }
      pfVar11 = (float *)((long)(this->super_GroupNorm).gamma_data.data +
                         (this->super_GroupNorm).gamma_data.elemsize * lVar18);
      fVar36 = fVar36 * fVar35;
      auVar32 = vshufps_avx(ZEXT416((uint)fVar36),ZEXT416((uint)fVar36),0);
      auVar56._16_16_ = auVar32;
      auVar56._0_16_ = auVar32;
      auVar33 = ZEXT1664(ZEXT816(0) << 0x40);
      for (uVar7 = 0; uVar7 != uVar8; uVar7 = uVar7 + 1) {
        pauVar12 = (undefined1 (*) [32])((long)pvVar1 + lVar10 * uVar7 + lVar6);
        auVar29 = ZEXT816(0) << 0x40;
        for (iVar17 = 0; iVar17 + 7 < iVar14; iVar17 = iVar17 + 8) {
          auVar55 = vsubps_avx(*pauVar12,auVar56);
          auVar29 = vfmadd231ps_fma(ZEXT1632(auVar29),auVar55,auVar55);
          pauVar12 = pauVar12 + 1;
        }
        auVar57._0_4_ = auVar29._0_4_ + 0.0;
        auVar57._4_4_ = auVar29._4_4_ + 0.0;
        auVar57._8_4_ = auVar29._8_4_ + 0.0;
        auVar57._12_4_ = auVar29._12_4_ + 0.0;
        auVar29 = vshufpd_avx(auVar57,auVar57,1);
        auVar58._0_4_ = auVar29._0_4_ + auVar57._0_4_;
        auVar58._4_4_ = auVar29._4_4_ + auVar57._4_4_;
        auVar58._8_4_ = auVar29._8_4_ + auVar57._8_4_;
        auVar58._12_4_ = auVar29._12_4_ + auVar57._12_4_;
        auVar29 = vmovshdup_avx(auVar58);
        auVar30 = ZEXT816(0) << 0x40;
        for (; iVar17 + 3 < iVar14; iVar17 = iVar17 + 4) {
          auVar43 = vsubps_avx(*(undefined1 (*) [16])*pauVar12,auVar32);
          auVar30 = vfmadd231ps_fma(auVar30,auVar43,auVar43);
          pauVar12 = (undefined1 (*) [32])(*pauVar12 + 0x10);
        }
        auVar43 = vshufpd_avx(auVar30,auVar30,1);
        auVar65._0_4_ = auVar43._0_4_ + auVar30._0_4_;
        auVar65._4_4_ = auVar43._4_4_ + auVar30._4_4_;
        auVar65._8_4_ = auVar43._8_4_ + auVar30._8_4_;
        auVar65._12_4_ = auVar43._12_4_ + auVar30._12_4_;
        auVar30 = vmovshdup_avx(auVar65);
        auVar33 = ZEXT464((uint)(auVar29._0_4_ + auVar33._0_4_ + auVar58._0_4_ +
                                auVar30._0_4_ + auVar65._0_4_));
        for (; iVar17 < iVar14; iVar17 = iVar17 + 1) {
          auVar29 = ZEXT416((uint)(*(float *)*pauVar12 - fVar36));
          auVar29 = vfmadd231ss_fma(auVar33._0_16_,auVar29,auVar29);
          auVar33 = ZEXT1664(auVar29);
          pauVar12 = (undefined1 (*) [32])(*pauVar12 + 4);
        }
      }
      puVar24 = (uint *)((long)(this->super_GroupNorm).beta_data.data +
                        lVar18 * (this->super_GroupNorm).beta_data.elemsize);
      auVar32 = vfmadd213ss_fma(auVar33._0_16_,ZEXT416((uint)fVar35),
                                ZEXT416((uint)(this->super_GroupNorm).eps));
      auVar32 = vsqrtss_avx(auVar32,auVar32);
      fVar25 = 1.0 / auVar32._0_4_;
      for (uVar7 = 0; uVar7 != uVar8; uVar7 = uVar7 + 1) {
        auVar32 = ZEXT416((uint)(fVar25 * -fVar36));
        fVar34 = fVar25;
        if ((this->super_GroupNorm).affine != 0) {
          fVar34 = *pfVar11 * fVar25;
          auVar32 = vfmadd213ss_fma(ZEXT416((uint)*pfVar11),auVar32,ZEXT416(*puVar24));
        }
        pauVar12 = (undefined1 (*) [32])((long)pvVar1 + lVar10 * uVar7 + lVar6);
        auVar43 = ZEXT416((uint)fVar34);
        auVar29 = vshufps_avx(auVar43,auVar43,0);
        auVar67._16_16_ = auVar29;
        auVar67._0_16_ = auVar29;
        auVar30 = vshufps_avx(auVar32,auVar32,0);
        auVar69._16_16_ = auVar30;
        auVar69._0_16_ = auVar30;
        for (iVar17 = 0; iVar17 + 7 < iVar14; iVar17 = iVar17 + 8) {
          auVar50 = vfmadd132ps_fma(*pauVar12,auVar69,auVar67);
          *pauVar12 = ZEXT1632(auVar50);
          pauVar12 = pauVar12 + 1;
        }
        for (; iVar17 + 3 < iVar14; iVar17 = iVar17 + 4) {
          auVar50 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar12,auVar30,auVar29);
          *(undefined1 (*) [16])*pauVar12 = auVar50;
          pauVar12 = (undefined1 (*) [32])(*pauVar12 + 0x10);
        }
        for (; iVar17 < iVar14; iVar17 = iVar17 + 1) {
          auVar29 = vfmadd132ss_fma(ZEXT416(*(uint *)*pauVar12),auVar32,auVar43);
          *(int *)*pauVar12 = auVar29._0_4_;
          pauVar12 = (undefined1 (*) [32])(*pauVar12 + 4);
        }
        pfVar11 = pfVar11 + 1;
        puVar24 = puVar24 + 1;
      }
      iVar17 = (this->super_GroupNorm).group;
    }
  }
  return 0;
}

Assistant:

int GroupNorm_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    const int dims = bottom_top_blob.dims;
    const int channels_per_group = channels / group;

    if (dims == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            float sum = 0.f;
            float* ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < channels_per_group; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < channels_per_group; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < channels_per_group; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / channels_per_group;

            float sqsum = 0.f;
            ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / channels_per_group + eps);
            float scale2 = -mean * scale1;

            ptr = bottom_top_blob_g;
            if (affine)
            {
                int i = 0;
                const float* gamma = gamma_data_g;
                const float* beta = beta_data_g;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _gamma = _mm512_loadu_ps(gamma);
                    __m512 _beta = _mm512_loadu_ps(beta);
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _a = _mm512_mul_ps(_gamma, _scale1_avx512);
                    __m512 _b = _mm512_add_ps(_mm512_mul_ps(_gamma, _scale2_avx512), _beta);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _a), _b);
                    _mm512_storeu_ps(ptr, _p);
                    gamma += 16;
                    beta += 16;
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _gamma = _mm256_loadu_ps(gamma);
                    __m256 _beta = _mm256_loadu_ps(beta);
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _a = _mm256_mul_ps(_gamma, _scale1_avx);
                    __m256 _b = _mm256_comp_fmadd_ps(_gamma, _scale2_avx, _beta);
                    _p = _mm256_comp_fmadd_ps(_p, _a, _b);
                    _mm256_storeu_ps(ptr, _p);
                    gamma += 8;
                    beta += 8;
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _gamma = _mm_loadu_ps(gamma);
                    __m128 _beta = _mm_loadu_ps(beta);
                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _a = _mm_mul_ps(_gamma, _scale1);
                    __m128 _b = _mm_comp_fmadd_ps(_gamma, _scale2, _beta);
                    _p = _mm_comp_fmadd_ps(_p, _a, _b);
                    _mm_storeu_ps(ptr, _p);
                    gamma += 4;
                    beta += 4;
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    float a = *gamma * scale1;
                    float b = *gamma * scale2 + *beta;
                    *ptr = *ptr * a + b;
                    gamma++;
                    beta++;
                    ptr++;
                }
            }
            else
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _scale1_avx512), _scale2_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _scale1_avx, _scale2_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _scale1, _scale2);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    *ptr = *ptr * scale1 + scale2;
                    ptr++;
                }
            }
        }

        return 0;
    }

    if (dims == 2)
    {
        int w = bottom_top_blob.w;
        int size = channels_per_group * w;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.row_range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            float* ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < size; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < size; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < size; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / size;

            float sqsum = 0.f;
            ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / size + eps);
            float scale2 = -mean * scale1;

            ptr = bottom_top_blob_g;
            if (affine)
            {
                const float* gamma = gamma_data_g;
                const float* beta = beta_data_g;
                for (int q = 0; q < channels_per_group; q++)
                {
                    float a = *gamma * scale1;
                    float b = *gamma * scale2 + *beta;
                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    __m512 _a_avx512 = _mm512_set1_ps(a);
                    __m512 _b_avx512 = _mm512_set1_ps(b);
                    for (; i + 15 < w; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(ptr);
                        _p = _mm512_add_ps(_mm512_mul_ps(_p, _a_avx512), _b_avx512);
                        _mm512_storeu_ps(ptr, _p);
                        ptr += 16;
                    }
#endif // __AVX512F__
                    __m256 _a_avx = _mm256_set1_ps(a);
                    __m256 _b_avx = _mm256_set1_ps(b);
                    for (; i + 7 < w; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p, _a_avx, _b_avx);
                        _mm256_storeu_ps(ptr, _p);
                        ptr += 8;
                    }
#endif // __AVX__
                    __m128 _a = _mm_set1_ps(a);
                    __m128 _b = _mm_set1_ps(b);
                    for (; i + 3 < w; i += 4)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_comp_fmadd_ps(_p, _a, _b);
                        _mm_storeu_ps(ptr, _p);
                        ptr += 4;
                    }
#endif // __SSE2__
                    for (; i < w; i++)
                    {
                        *ptr = *ptr * a + b;
                        ptr++;
                    }
                    gamma++;
                    beta++;
                }
            }
            else
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _scale1_avx512), _scale2_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _scale1_avx, _scale2_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _scale1, _scale2);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *ptr = *ptr * scale1 + scale2;
                    ptr++;
                }
            }
        }

        return 0;
    }

    if (dims == 3 || dims == 4)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int d = bottom_top_blob.d;
        int size = w * h * d;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.channel_range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < size; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < size; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < size; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / (channels_per_group * size);

            float sqsum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / (channels_per_group * size) + eps);
            float scale2 = -mean * scale1;

            const float* gamma = gamma_data_g;
            const float* beta = beta_data_g;
            for (int q = 0; q < channels_per_group; q++)
            {
                float a = scale1;
                float b = scale2;
                if (affine)
                {
                    a = *gamma * a;
                    b = *gamma * b + *beta;
                }

                float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _a_avx512 = _mm512_set1_ps(a);
                __m512 _b_avx512 = _mm512_set1_ps(b);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _a_avx512), _b_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _a_avx = _mm256_set1_ps(a);
                __m256 _b_avx = _mm256_set1_ps(b);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _a_avx, _b_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _a = _mm_set1_ps(a);
                __m128 _b = _mm_set1_ps(b);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _a, _b);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *ptr = *ptr * a + b;
                    ptr++;
                }

                gamma++;
                beta++;
            }
        }

        return 0;
    }

    return 0;
}